

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

GLFWjoystickfun glfwSetJoystickCallback(GLFWjoystickfun cbfun)

{
  GLFWbool GVar1;
  GLFWjoystickfun t;
  GLFWjoystickfun cbfun_local;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    cbfun_local = (GLFWjoystickfun)0x0;
  }
  else {
    GVar1 = initJoysticks();
    if (GVar1 == 0) {
      cbfun_local = (GLFWjoystickfun)0x0;
    }
    else {
      cbfun_local = _glfw.callbacks.joystick;
      _glfw.callbacks.joystick = cbfun;
    }
  }
  return cbfun_local;
}

Assistant:

GLFWAPI GLFWjoystickfun glfwSetJoystickCallback(GLFWjoystickfun cbfun)
{
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!initJoysticks())
        return NULL;

    _GLFW_SWAP(GLFWjoystickfun, _glfw.callbacks.joystick, cbfun);
    return cbfun;
}